

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpConnection.h
# Opt level: O0

void __thiscall
sznet::net::KcpConnection::KcpSettings::KcpSettings
          (KcpSettings *this,uint8_t noDelay,int interval,int resend,uint8_t noFlowControl,
          int minrto)

{
  int minrto_local;
  uint8_t noFlowControl_local;
  int resend_local;
  int interval_local;
  uint8_t noDelay_local;
  KcpSettings *this_local;
  
  this->m_noDelay = noDelay;
  this->m_interval = interval;
  this->m_resend = resend;
  this->m_noFlowControl = noFlowControl;
  this->m_mtu = 0x5d2;
  this->m_sndWnd = 0x100;
  this->m_rcvWnd = 0x200;
  this->m_minrto = minrto;
  this->m_isStream = '\x01';
  return;
}

Assistant:

KcpSettings(uint8_t noDelay, int interval, int resend, uint8_t noFlowControl, int minrto):
			m_noDelay(noDelay),
			m_interval(interval),
			m_resend(resend),
			m_noFlowControl(noFlowControl),
			m_minrto(minrto),
			m_isStream(1),
			m_mtu(1500 - 2 - 8),
			m_sndWnd(256),
			m_rcvWnd(512)
		{
		}